

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::RegularExpression::matchBackReference
          (RegularExpression *this,Context *context,XMLInt32 refNo,XMLSize_t *offset,bool ignoreCase
          )

{
  int iVar1;
  int iVar2;
  IllegalArgumentException *this_00;
  bool local_61;
  bool match;
  int length;
  int start;
  bool ignoreCase_local;
  XMLSize_t *offset_local;
  XMLInt32 refNo_local;
  Context *context_local;
  RegularExpression *this_local;
  
  if ((refNo < 1) || (this->fNoGroups <= refNo)) {
    this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x30);
    IllegalArgumentException::IllegalArgumentException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RegularExpression.cpp"
               ,0x528,Regex_BadRefNo,context->fMemoryManager);
    __cxa_throw(this_00,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  iVar1 = Match::getStartPos(context->fMatch,refNo);
  if ((-1 < iVar1) && (iVar1 = Match::getEndPos(context->fMatch,refNo), -1 < iVar1)) {
    iVar1 = Match::getStartPos(context->fMatch,refNo);
    iVar2 = Match::getEndPos(context->fMatch,refNo);
    iVar2 = iVar2 - iVar1;
    if ((int)context->fLimit - (int)*offset < iVar2) {
      return false;
    }
    if (ignoreCase) {
      local_61 = XMLString::regionIMatches
                           (context->fString,(int)*offset,context->fString,iVar1,(long)iVar2);
    }
    else {
      local_61 = XMLString::regionMatches
                           (context->fString,(int)*offset,context->fString,iVar1,(long)iVar2);
    }
    if (local_61 != false) {
      *offset = (long)iVar2 + *offset;
    }
    return local_61;
  }
  return true;
}

Assistant:

bool RegularExpression::matchBackReference(Context* const context,
                                           const XMLInt32 refNo, XMLSize_t& offset,
                                           const bool ignoreCase) const
{
    if (refNo <=0 || refNo >= fNoGroups)
        ThrowXMLwithMemMgr(IllegalArgumentException, XMLExcepts::Regex_BadRefNo, context->fMemoryManager);

    // If the group we're matching against wasn't matched,
    // the back reference matches the empty string
    if (context->fMatch->getStartPos(refNo) < 0 || context->fMatch->getEndPos(refNo) < 0)
        return true;

    int start = context->fMatch->getStartPos(refNo);
    int length = context->fMatch->getEndPos(refNo) - start;

    if (int(context->fLimit - offset) < length)
        return false;

    bool match = ignoreCase ? XMLString::regionIMatches(context->fString,(int)offset,
                                                        context->fString,start,length)
                            : XMLString::regionMatches(context->fString, (int)offset,
                                                       context->fString, start,length);

    if (match) offset += length;
    return match;
}